

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  Fad<double> *pFVar9;
  uint uVar10;
  ulong uVar11;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar12;
  value_type vVar13;
  
  pFVar12 = (fadexpr->fadexpr_).left_;
  pFVar9 = (pFVar12->fadexpr_).right_;
  uVar10 = (pFVar9->dx_).num_elts;
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar10) {
    uVar2 = uVar10;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_00dc229c;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dc229c;
    }
    if (uVar3 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar12 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar11 = (ulong)uVar2 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar11);
    (this->dx_).ptr_to_data = pdVar8;
    pFVar9 = (pFVar12->fadexpr_).right_;
    uVar10 = (pFVar9->dx_).num_elts;
  }
  if (uVar10 != 0) {
    pFVar4 = (fadexpr->fadexpr_).right_;
    pFVar5 = (pFVar4->fadexpr_).right_;
    if ((pFVar5->dx_).num_elts != 0) {
      if (0 < (int)uVar2) {
        pdVar6 = (pFVar9->dx_).ptr_to_data;
        pdVar7 = (pFVar5->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          dVar1 = (pFVar12->fadexpr_).left_.constant_;
          pdVar8[uVar11] =
               dVar1 * pFVar9->val_ * pdVar7[uVar11] +
               ((pFVar4->fadexpr_).left_.constant_ + pFVar5->val_) * pdVar6[uVar11] * dVar1;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      goto LAB_00dc229c;
    }
  }
  if (0 < (int)uVar2) {
    uVar11 = 0;
    do {
      vVar13 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar11);
      pdVar8[uVar11] = vVar13;
      uVar11 = uVar11 + 1;
    } while (uVar2 != uVar11);
  }
LAB_00dc229c:
  pFVar12 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  this->val_ = ((pFVar4->fadexpr_).left_.constant_ + ((pFVar4->fadexpr_).right_)->val_) *
               (pFVar12->fadexpr_).left_.constant_ * ((pFVar12->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}